

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AvalancheTest.cpp
# Opt level: O0

double maxBias(vector<int,_std::allocator<int>_> *counts,int reps)

{
  size_type sVar1;
  reference pvVar2;
  int in_ESI;
  vector<int,_std::allocator<int>_> *in_RDI;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  double d;
  double c;
  int i;
  double worst;
  undefined4 local_1c;
  undefined8 local_18;
  
  local_18 = 0.0;
  local_1c = 0;
  while( true ) {
    sVar1 = std::vector<int,_std::allocator<int>_>::size(in_RDI);
    if ((int)sVar1 <= local_1c) break;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](in_RDI,(long)local_1c);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = (double)*pvVar2 / (double)in_ESI;
    auVar3 = vfmadd213sd_fma(ZEXT816(0x4000000000000000),auVar3,ZEXT816(0xbff0000000000000));
    auVar4._8_8_ = 0x7fffffffffffffff;
    auVar4._0_8_ = 0x7fffffffffffffff;
    auVar3 = vpand_avx(auVar3,auVar4);
    if (local_18 < auVar3._0_8_) {
      local_18 = auVar3._0_8_;
    }
    local_1c = local_1c + 1;
  }
  return local_18;
}

Assistant:

double maxBias ( std::vector<int> & counts, int reps )
{
  double worst = 0;

  for(int i = 0; i < (int)counts.size(); i++)
  {
    double c = double(counts[i]) / double(reps);

    double d = fabs(c * 2 - 1);

    if(d > worst)
    {
      worst = d;
    }
  }

  return worst;
}